

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O0

void __thiscall
vkt::api::anon_unknown_0::CheckIncompleteResult<vk::VkExtensionProperties>::operator()
          (CheckIncompleteResult<vk::VkExtensionProperties> *this,Context *context,
          ResultCollector *results,size_t expectedCompleteSize)

{
  bool bVar1;
  reference pvVar2;
  byte local_d1;
  allocator<char> local_a1;
  string local_a0;
  VkExtensionProperties *local_80;
  __normal_iterator<vk::VkExtensionProperties_*,_std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>_>
  local_78;
  __normal_iterator<vk::VkExtensionProperties_*,_std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>_>
  local_70;
  VkExtensionProperties *local_68;
  __normal_iterator<vk::VkExtensionProperties_*,_std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>_>
  local_60;
  deUint32 local_58;
  deUint32 usedSize;
  allocator<vk::VkExtensionProperties> local_41;
  undefined1 local_40 [8];
  vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> outputData;
  size_t expectedCompleteSize_local;
  ResultCollector *results_local;
  Context *context_local;
  CheckIncompleteResult<vk::VkExtensionProperties> *this_local;
  
  if (expectedCompleteSize != 0) {
    outputData.
    super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)expectedCompleteSize;
    std::allocator<vk::VkExtensionProperties>::allocator(&local_41);
    std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::vector
              ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *)
               local_40,expectedCompleteSize,&local_41);
    std::allocator<vk::VkExtensionProperties>::~allocator(&local_41);
    local_58 = (deUint32)
               ((ulong)outputData.
                       super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage / 3);
    local_60._M_current =
         (VkExtensionProperties *)
         std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::begin
                   ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *
                    )local_40);
    local_68 = (VkExtensionProperties *)
               std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::
               end((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *)
                   local_40);
    ::vk::ValidateQueryBits::
    fillBits<__gnu_cxx::__normal_iterator<vk::VkExtensionProperties*,std::vector<vk::VkExtensionProperties,std::allocator<vk::VkExtensionProperties>>>>
              (local_60,(__normal_iterator<vk::VkExtensionProperties_*,_std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>_>
                         )local_68,0xde);
    this->m_count = local_58;
    this->m_result = VK_SUCCESS;
    pvVar2 = std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::
             operator[]((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                         *)local_40,0);
    (*this->_vptr_CheckIncompleteResult[2])(this,context,pvVar2);
    local_d1 = 1;
    if ((this->m_count == local_58) && (local_d1 = 1, this->m_result == VK_INCOMPLETE)) {
      local_78._M_current =
           (VkExtensionProperties *)
           std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::begin
                     ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                       *)local_40);
      local_70 = __gnu_cxx::
                 __normal_iterator<vk::VkExtensionProperties_*,_std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>_>
                 ::operator+(&local_78,(ulong)this->m_count);
      local_80 = (VkExtensionProperties *)
                 std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                 ::end((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                        *)local_40);
      bVar1 = ::vk::ValidateQueryBits::
              checkBits<__gnu_cxx::__normal_iterator<vk::VkExtensionProperties*,std::vector<vk::VkExtensionProperties,std::allocator<vk::VkExtensionProperties>>>>
                        (local_70,(__normal_iterator<vk::VkExtensionProperties_*,_std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>_>
                                   )local_80,0xde);
      local_d1 = bVar1 ^ 0xff;
    }
    if ((local_d1 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"Query didn\'t return VK_INCOMPLETE",&local_a1);
      tcu::ResultCollector::fail(results,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator(&local_a1);
    }
    std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::~vector
              ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *)
               local_40);
  }
  return;
}

Assistant:

void operator() (Context& context, tcu::ResultCollector& results, const std::size_t expectedCompleteSize)
	{
		if (expectedCompleteSize == 0)
			return;

		vector<T>		outputData	(expectedCompleteSize);
		const deUint32	usedSize	= static_cast<deUint32>(expectedCompleteSize / 3);

		ValidateQueryBits::fillBits(outputData.begin(), outputData.end());	// unused entries should have this pattern intact
		m_count		= usedSize;
		m_result	= VK_SUCCESS;

		getResult(context, &outputData[0]);									// update m_count and m_result

		if (m_count != usedSize || m_result != VK_INCOMPLETE || !ValidateQueryBits::checkBits(outputData.begin() + m_count, outputData.end()))
			results.fail("Query didn't return VK_INCOMPLETE");
	}